

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O2

void TestWaveform(AmpIO *board)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  byte bVar4;
  long lVar5;
  byte bVar6;
  char *pcVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  double extraout_XMM0_Qa;
  quadlet_t waveform_read [256];
  quadlet_t waveform [256];
  quadlet_t local_818 [514];
  
  (*(board->super_FpgaIO).super_BoardIO._vptr_BoardIO[10])();
  poVar2 = std::operator<<((ostream *)&std::cout,"Setting waveform with ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," counts (1 msec edges)");
  std::endl<char,std::char_traits<char>>(poVar2);
  uVar11 = (uint)(long)(0.001 / extraout_XMM0_Qa);
  if (0x7fffff < uVar11) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Warning: numTicks does not fit in 23 bits");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar4 = 0;
  bVar6 = 0;
  bVar8 = 0;
  bVar9 = 0;
  for (uVar3 = 0; uVar3 != 0xff; uVar3 = uVar3 + 1) {
    uVar10 = (uint)uVar3 & 3;
    if ((uVar3 & 3) == 0) {
      bVar4 = 1 - bVar4;
    }
    if (uVar10 == 1) {
      bVar6 = 1 - bVar6;
    }
    if (uVar10 == 2) {
      bVar8 = 1 - bVar8;
    }
    if (uVar10 == 3) {
      bVar9 = 1 - bVar9;
    }
    local_818[uVar3 + 0x100] =
         (uint)bVar4 | uVar11 << 8 | (uint)bVar6 * 2 | (uint)bVar8 << 2 | (uint)bVar9 << 3 |
         0x80000000;
    local_818[uVar3] = 0;
  }
  local_818[0x1ff] = 0;
  local_818[0xff] = 0;
  poVar2 = std::operator<<((ostream *)&std::cout,"Writing test pattern");
  std::endl<char,std::char_traits<char>>(poVar2);
  bVar1 = AmpIO::WriteWaveformTable(board,local_818 + 0x100,0,0x100);
  if (bVar1) {
    Amp1394_Sleep(0.05);
    poVar2 = std::operator<<((ostream *)&std::cout,"Reading data");
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = AmpIO::ReadWaveformTable(board,local_818,0,0x100);
    if (bVar1) {
      for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
        if (local_818[lVar5] != local_818[lVar5 + 0x100]) {
          poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at quadlet ");
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          poVar2 = std::operator<<(poVar2,", read ");
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          poVar2 = std::operator<<(poVar2,", expected ");
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
          goto LAB_00107a6b;
        }
      }
      pcVar7 = "Pattern verified!";
    }
    else {
      pcVar7 = "ReadWaveformTable failed";
    }
  }
  else {
    pcVar7 = "WriteWaveformTable failed";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar7);
LAB_00107a6b:
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void TestWaveform(AmpIO *board)
{
    const unsigned int WLEN = 256;
    quadlet_t waveform[WLEN];
    quadlet_t waveform_read[WLEN];
    size_t i;
    // Set up square waves that change every 1 msec
    double clkPer = board->GetFPGAClockPeriod();
    uint32_t numTicks = static_cast<uint32_t>(0.001/clkPer);
    std::cout << "Setting waveform with " << numTicks << " counts (1 msec edges)" << std::endl;
    if ((numTicks&0x7fffff) != numTicks)
        std::cout << "Warning: numTicks does not fit in 23 bits" << std::endl;
    unsigned char dout1 = 0;
    unsigned char dout2 = 0;
    unsigned char dout3 = 0;
    unsigned char dout4 = 0;
    for (i = 0; i < WLEN-1; i++) {
        if (i%4 == 0) dout1 = 1-dout1;
        if (i%4 == 1) dout2 = 1-dout2;
        if (i%4 == 2) dout3 = 1-dout3;
        if (i%4 == 3) dout4 = 1-dout4;
        waveform[i] = 0x80000000 | (numTicks << 8) | (dout4 << 3) | (dout3 << 2) | (dout2 << 1) | dout1;
        waveform_read[i] = 0;
    }
    waveform[WLEN-1] = 0;
    waveform_read[WLEN-1] = 0;
    std::cout << "Writing test pattern" << std::endl;
    if (!board->WriteWaveformTable(waveform, 0, WLEN)) {
        std::cout << "WriteWaveformTable failed" << std::endl;
        return;
    }
    Amp1394_Sleep(0.05);
    std::cout << "Reading data" << std::endl;
    if (!board->ReadWaveformTable(waveform_read, 0, WLEN)) {
        std::cout << "ReadWaveformTable failed" << std::endl;
        return;
    }
    for (i = 0; i < WLEN; i++) {
        if (waveform_read[i] != waveform[i]) {
            std::cout << "Mismatch at quadlet " << i << ", read " << std::hex
                      << waveform_read[i] << ", expected " << waveform[i]
                      << std::dec << std::endl;
            return;
        }
    }
    std::cout << "Pattern verified!" << std::endl;
#if 0
    // Following code will actually generate waveform on DOUT lines
    board->WriteDigitalOutput(0x0f,0x00);
    // Start waveform on all DOUT channels
    board->WriteWaveformControl(0x0f, 0x0f);
#endif
}